

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_rmdir_ex(LIBSSH2_SFTP *sftp,char *path,uint path_len)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    sftp_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._0_4_ = sftp_rmdir(sftp,path,path_len);
      if ((((int)entry_time != -0x25) || (sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (sftp->channel->session->api_block_mode == 0)) break;
      entry_time._0_4_ = _libssh2_wait_socket(sftp->channel->session,start_time);
    } while ((int)entry_time == 0);
    sftp_local._4_4_ = (int)entry_time;
  }
  return sftp_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_rmdir_ex(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_rmdir(sftp, path, path_len));
    return rc;
}